

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O2

GameMode menuMain(Windows *gameInterface)

{
  WINDOW *pWVar1;
  int iVar2;
  GameMode GVar3;
  
  pWVar1 = gameInterface->menu;
  wclear(pWVar1);
  wborder(pWVar1,0,0,0,0,0,0,0,0);
  iVar2 = wmove(pWVar1,3,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"8888888b. 8888888 .d88888b.88888888888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,4,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"888   Y88b  888  d88P   Y88b   888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,5,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"888    888  888  888     888   888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,6,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"888   d88P  888  888     888   888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,7,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"8888888P    888  888     888   888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,8,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"888 T88b    888  888     888   888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,9,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"888  T88b   888  Y88b. .d88P   888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,10,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"888   T88b8888888  Y88888P     888",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,0xd,0x15);
  if (iVar2 != -1) {
    whline(pWVar1,_DAT_0010926c,0x25);
  }
  iVar2 = wmove(pWVar1,0x10,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"GAME MENU",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,0x12,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"[n]ew game",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,0x13,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"[c]ontinue",0xffffffffffffffff);
  }
  iVar2 = wmove(pWVar1,0x14,0x15);
  if (iVar2 != -1) {
    waddnstr(pWVar1,"[e]xit",0xffffffffffffffff);
  }
  wrefresh(pWVar1);
  GVar3 = _GAME_MODE_LIMIT;
  while( true ) {
    if ((GVar3 - CONTINUE < 0xc) && ((0x805U >> (GVar3 - CONTINUE & 0x1f) & 1) != 0)) break;
    GVar3 = wgetch(pWVar1);
  }
  return GVar3;
}

Assistant:

enum GameMode menuMain(struct Windows *gameInterface) {

    enum GameMode gameMode = _GAME_MODE_LIMIT;
    WINDOW *menu = gameInterface->menu;

    int y = 3;

    wclear(menu);
    box(menu, 0, 0);
    mvwaddstr(menu, y++, 21, "8888888b. 8888888 .d88888b.88888888888");
    mvwaddstr(menu, y++, 21, "888   Y88b  888  d88P   Y88b   888");
    mvwaddstr(menu, y++, 21, "888    888  888  888     888   888");
    mvwaddstr(menu, y++, 21, "888   d88P  888  888     888   888");
    mvwaddstr(menu, y++, 21, "8888888P    888  888     888   888");
    mvwaddstr(menu, y++, 21, "888 T88b    888  888     888   888");
    mvwaddstr(menu, y++, 21, "888  T88b   888  Y88b. .d88P   888");
    mvwaddstr(menu, y++, 21, "888   T88b8888888  Y88888P     888");

    mvwhline(menu, y += 2, 21, ACS_HLINE, 37);

    mvwaddstr(menu, y += 3, 21, "GAME MENU");
    y += 2;
    mvwaddstr(menu, y++, 21, "[n]ew game");
    mvwaddstr(menu, y++, 21, "[c]ontinue");
    mvwaddstr(menu, y++, 21, "[e]xit");

    wrefresh(menu);

    while (gameMode != NEW && gameMode != CONTINUE && gameMode != EXIT)
        gameMode = wgetch(menu);

    return gameMode;
}